

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 (*pauVar29) [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong *puVar39;
  ulong uVar40;
  byte bVar41;
  int iVar42;
  ulong uVar43;
  uint uVar44;
  long lVar45;
  ulong uVar46;
  bool bVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  uint uVar61;
  uint uVar62;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  uint uVar63;
  undefined1 auVar60 [32];
  vint4 bi;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  vint4 ai;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  NodeRef stack [244];
  undefined1 local_a40 [32];
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar39 = local_7f8;
  local_800 = root.ptr;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar49._4_4_ = fVar2;
  auVar49._0_4_ = fVar2;
  auVar49._8_4_ = fVar2;
  auVar49._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar50._4_4_ = fVar3;
  auVar50._0_4_ = fVar3;
  auVar50._8_4_ = fVar3;
  auVar50._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar51._4_4_ = fVar4;
  auVar51._0_4_ = fVar4;
  auVar51._8_4_ = fVar4;
  auVar51._12_4_ = fVar4;
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar4 = fVar4 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  auVar52._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar52._8_4_ = -fVar2;
  auVar52._12_4_ = -fVar2;
  auVar53._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar53._8_4_ = -fVar3;
  auVar53._12_4_ = -fVar3;
  iVar42 = (tray->tnear).field_0.i[k];
  auVar54._4_4_ = iVar42;
  auVar54._0_4_ = iVar42;
  auVar54._8_4_ = iVar42;
  auVar54._12_4_ = iVar42;
  iVar42 = (tray->tfar).field_0.i[k];
  auVar55._4_4_ = iVar42;
  auVar55._0_4_ = iVar42;
  auVar55._8_4_ = iVar42;
  auVar55._12_4_ = iVar42;
  auVar56._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  auVar56._8_4_ = -fVar4;
  auVar56._12_4_ = -fVar4;
  bVar48 = true;
  auVar58._8_4_ = 0x80000000;
  auVar58._0_8_ = 0x8000000080000000;
  auVar58._12_4_ = 0x80000000;
  auVar58._16_4_ = 0x80000000;
  auVar58._20_4_ = 0x80000000;
  auVar58._24_4_ = 0x80000000;
  auVar58._28_4_ = 0x80000000;
  do {
    uVar43 = puVar39[-1];
    puVar39 = puVar39 + -1;
    while ((uVar43 & 8) == 0) {
      auVar57 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar43 + 0x20 + uVar35),auVar52,auVar49);
      auVar18 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar43 + 0x20 + uVar38),auVar53,auVar50);
      auVar57 = vpmaxsd_avx(auVar57,auVar18);
      auVar18 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar43 + 0x20 + uVar40),auVar56,auVar51);
      auVar18 = vpmaxsd_avx(auVar18,auVar54);
      auVar57 = vpmaxsd_avx(auVar57,auVar18);
      auVar18 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar43 + 0x20 + (uVar35 ^ 0x10)),auVar52,
                                auVar49);
      auVar19 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar43 + 0x20 + (uVar38 ^ 0x10)),auVar53,
                                auVar50);
      auVar18 = vpminsd_avx(auVar18,auVar19);
      auVar19 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar43 + 0x20 + (uVar40 ^ 0x10)),auVar56,
                                auVar51);
      auVar19 = vpminsd_avx(auVar19,auVar55);
      auVar18 = vpminsd_avx(auVar18,auVar19);
      auVar57 = vpcmpgtd_avx(auVar57,auVar18);
      iVar42 = vmovmskps_avx(auVar57);
      if (iVar42 == 0xf) goto LAB_00574bdb;
      bVar41 = (byte)iVar42 ^ 0xf;
      uVar36 = uVar43 & 0xfffffffffffffff0;
      lVar37 = 0;
      for (uVar43 = (ulong)bVar41; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
        lVar37 = lVar37 + 1;
      }
      uVar43 = *(ulong *)(uVar36 + lVar37 * 8);
      uVar44 = bVar41 - 1 & (uint)bVar41;
      uVar46 = (ulong)uVar44;
      if (uVar44 != 0) {
        *puVar39 = uVar43;
        lVar37 = 0;
        for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
          lVar37 = lVar37 + 1;
        }
        uVar44 = uVar44 - 1 & uVar44;
        uVar46 = (ulong)uVar44;
        bVar47 = uVar44 == 0;
        while( true ) {
          puVar39 = puVar39 + 1;
          uVar43 = *(ulong *)(uVar36 + lVar37 * 8);
          if (bVar47) break;
          *puVar39 = uVar43;
          lVar37 = 0;
          for (uVar43 = uVar46; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
            lVar37 = lVar37 + 1;
          }
          uVar46 = uVar46 - 1 & uVar46;
          bVar47 = uVar46 == 0;
        }
      }
    }
    uVar36 = (ulong)((uint)uVar43 & 0xf);
    if (uVar36 != 8) {
      uVar5 = *(undefined4 *)(ray + k * 4);
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x20);
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x40);
      fVar2 = *(float *)(ray + k * 4 + 0x80);
      fVar3 = *(float *)(ray + k * 4 + 0xa0);
      uVar43 = uVar43 & 0xfffffffffffffff0;
      fVar4 = *(float *)(ray + k * 4 + 0xc0);
      lVar37 = 0;
      do {
        lVar45 = lVar37 * 0xe0;
        lVar1 = uVar43 + 0xc0 + lVar45;
        local_820 = *(undefined8 *)(lVar1 + 0x10);
        uStack_818 = *(undefined8 *)(lVar1 + 0x18);
        uStack_810 = local_820;
        uStack_808 = uStack_818;
        auVar70._16_16_ = *(undefined1 (*) [16])(uVar43 + 0x60 + lVar45);
        auVar70._0_16_ = *(undefined1 (*) [16])(uVar43 + lVar45);
        auVar74._16_16_ = *(undefined1 (*) [16])(uVar43 + 0x70 + lVar45);
        auVar74._0_16_ = *(undefined1 (*) [16])(uVar43 + 0x10 + lVar45);
        auVar72._16_16_ = *(undefined1 (*) [16])(uVar43 + 0x80 + lVar45);
        auVar72._0_16_ = *(undefined1 (*) [16])(uVar43 + 0x20 + lVar45);
        auVar57 = *(undefined1 (*) [16])(uVar43 + 0x30 + lVar45);
        auVar59._16_16_ = auVar57;
        auVar59._0_16_ = auVar57;
        auVar57 = *(undefined1 (*) [16])(uVar43 + 0x40 + lVar45);
        auVar69._16_16_ = auVar57;
        auVar69._0_16_ = auVar57;
        lVar1 = uVar43 + 0x50 + lVar45;
        pauVar29 = (undefined1 (*) [16])(lVar1 + 0x10);
        local_a40._16_8_ = *(undefined8 *)*pauVar29;
        local_a40._0_16_ = *pauVar29;
        local_a40._24_8_ = *(undefined8 *)(lVar1 + 0x18);
        lVar1 = uVar43 + 0x90 + lVar45;
        pauVar29 = (undefined1 (*) [16])(lVar1 + 0x10);
        local_a00._16_8_ = *(undefined8 *)*pauVar29;
        local_a00._0_16_ = *pauVar29;
        local_a00._24_8_ = *(undefined8 *)(lVar1 + 0x18);
        auVar57 = *(undefined1 (*) [16])(uVar43 + 0xa0 + lVar45);
        auVar73._16_16_ = auVar57;
        auVar73._0_16_ = auVar57;
        lVar45 = uVar43 + 0xb0 + lVar45;
        pauVar29 = (undefined1 (*) [16])(lVar45 + 0x10);
        local_9e0._16_8_ = *(undefined8 *)*pauVar29;
        local_9e0._0_16_ = *pauVar29;
        local_9e0._24_8_ = *(undefined8 *)(lVar45 + 0x18);
        auVar9 = vsubps_avx(auVar70,auVar59);
        auVar67 = vsubps_avx(auVar74,auVar69);
        auVar10 = vsubps_avx(auVar72,local_a40);
        auVar59 = vsubps_avx(local_a00,auVar70);
        auVar11 = vsubps_avx(auVar73,auVar74);
        auVar12 = vsubps_avx(local_9e0,auVar72);
        auVar13._4_4_ = auVar67._4_4_ * auVar12._4_4_;
        auVar13._0_4_ = auVar67._0_4_ * auVar12._0_4_;
        auVar13._8_4_ = auVar67._8_4_ * auVar12._8_4_;
        auVar13._12_4_ = auVar67._12_4_ * auVar12._12_4_;
        auVar13._16_4_ = auVar67._16_4_ * auVar12._16_4_;
        auVar13._20_4_ = auVar67._20_4_ * auVar12._20_4_;
        auVar13._24_4_ = auVar67._24_4_ * auVar12._24_4_;
        auVar13._28_4_ = auVar57._12_4_;
        auVar20 = vfmsub231ps_fma(auVar13,auVar11,auVar10);
        auVar14._4_4_ = auVar10._4_4_ * auVar59._4_4_;
        auVar14._0_4_ = auVar10._0_4_ * auVar59._0_4_;
        auVar14._8_4_ = auVar10._8_4_ * auVar59._8_4_;
        auVar14._12_4_ = auVar10._12_4_ * auVar59._12_4_;
        auVar14._16_4_ = auVar10._16_4_ * auVar59._16_4_;
        auVar14._20_4_ = auVar10._20_4_ * auVar59._20_4_;
        auVar14._24_4_ = auVar10._24_4_ * auVar59._24_4_;
        auVar14._28_4_ = auVar11._28_4_;
        auVar21 = vfmsub231ps_fma(auVar14,auVar12,auVar9);
        auVar34._4_4_ = uVar5;
        auVar34._0_4_ = uVar5;
        auVar34._8_4_ = uVar5;
        auVar34._12_4_ = uVar5;
        auVar34._16_4_ = uVar5;
        auVar34._20_4_ = uVar5;
        auVar34._24_4_ = uVar5;
        auVar34._28_4_ = uVar5;
        auVar13 = vsubps_avx(auVar70,auVar34);
        auVar33._4_4_ = uVar6;
        auVar33._0_4_ = uVar6;
        auVar33._8_4_ = uVar6;
        auVar33._12_4_ = uVar6;
        auVar33._16_4_ = uVar6;
        auVar33._20_4_ = uVar6;
        auVar33._24_4_ = uVar6;
        auVar33._28_4_ = uVar6;
        auVar14 = vsubps_avx(auVar74,auVar33);
        auVar15._4_4_ = uVar7;
        auVar15._0_4_ = uVar7;
        auVar15._8_4_ = uVar7;
        auVar15._12_4_ = uVar7;
        auVar15._16_4_ = uVar7;
        auVar15._20_4_ = uVar7;
        auVar15._24_4_ = uVar7;
        auVar15._28_4_ = uVar7;
        auVar15 = vsubps_avx(auVar72,auVar15);
        auVar30._4_4_ = fVar2;
        auVar30._0_4_ = fVar2;
        auVar30._8_4_ = fVar2;
        auVar30._12_4_ = fVar2;
        auVar30._16_4_ = fVar2;
        auVar30._20_4_ = fVar2;
        auVar30._24_4_ = fVar2;
        auVar30._28_4_ = fVar2;
        auVar24._4_4_ = fVar2 * auVar14._4_4_;
        auVar24._0_4_ = fVar2 * auVar14._0_4_;
        auVar24._8_4_ = fVar2 * auVar14._8_4_;
        auVar24._12_4_ = fVar2 * auVar14._12_4_;
        auVar24._16_4_ = fVar2 * auVar14._16_4_;
        auVar24._20_4_ = fVar2 * auVar14._20_4_;
        auVar24._24_4_ = fVar2 * auVar14._24_4_;
        auVar24._28_4_ = auVar15._28_4_;
        auVar32._4_4_ = fVar3;
        auVar32._0_4_ = fVar3;
        auVar32._8_4_ = fVar3;
        auVar32._12_4_ = fVar3;
        auVar32._16_4_ = fVar3;
        auVar32._20_4_ = fVar3;
        auVar32._24_4_ = fVar3;
        auVar32._28_4_ = fVar3;
        auVar57 = vfmsub231ps_fma(auVar24,auVar13,auVar32);
        auVar25._4_4_ = auVar12._4_4_ * auVar57._4_4_;
        auVar25._0_4_ = auVar12._0_4_ * auVar57._0_4_;
        auVar25._8_4_ = auVar12._8_4_ * auVar57._8_4_;
        auVar25._12_4_ = auVar12._12_4_ * auVar57._12_4_;
        auVar25._16_4_ = auVar12._16_4_ * 0.0;
        auVar25._20_4_ = auVar12._20_4_ * 0.0;
        auVar25._24_4_ = auVar12._24_4_ * 0.0;
        auVar25._28_4_ = fVar2;
        auVar64._0_4_ = auVar57._0_4_ * auVar10._0_4_;
        auVar64._4_4_ = auVar57._4_4_ * auVar10._4_4_;
        auVar64._8_4_ = auVar57._8_4_ * auVar10._8_4_;
        auVar64._12_4_ = auVar57._12_4_ * auVar10._12_4_;
        auVar64._16_4_ = auVar10._16_4_ * 0.0;
        auVar64._20_4_ = auVar10._20_4_ * 0.0;
        auVar64._24_4_ = auVar10._24_4_ * 0.0;
        auVar64._28_4_ = 0;
        auVar31._4_4_ = fVar4;
        auVar31._0_4_ = fVar4;
        auVar31._8_4_ = fVar4;
        auVar31._12_4_ = fVar4;
        auVar31._16_4_ = fVar4;
        auVar31._20_4_ = fVar4;
        auVar31._24_4_ = fVar4;
        auVar31._28_4_ = fVar4;
        auVar10._4_4_ = fVar4 * auVar13._4_4_;
        auVar10._0_4_ = fVar4 * auVar13._0_4_;
        auVar10._8_4_ = fVar4 * auVar13._8_4_;
        auVar10._12_4_ = fVar4 * auVar13._12_4_;
        auVar10._16_4_ = fVar4 * auVar13._16_4_;
        auVar10._20_4_ = fVar4 * auVar13._20_4_;
        auVar10._24_4_ = fVar4 * auVar13._24_4_;
        auVar10._28_4_ = auVar12._28_4_;
        auVar18 = vfmsub231ps_fma(auVar10,auVar30,auVar15);
        auVar57 = vfmadd231ps_fma(auVar25,ZEXT1632(auVar18),auVar11);
        local_9a0 = auVar9._0_4_;
        fStack_99c = auVar9._4_4_;
        fStack_998 = auVar9._8_4_;
        fStack_994 = auVar9._12_4_;
        fStack_990 = auVar9._16_4_;
        fStack_98c = auVar9._20_4_;
        fStack_988 = auVar9._24_4_;
        auVar12._4_4_ = auVar11._4_4_ * fStack_99c;
        auVar12._0_4_ = auVar11._0_4_ * local_9a0;
        auVar12._8_4_ = auVar11._8_4_ * fStack_998;
        auVar12._12_4_ = auVar11._12_4_ * fStack_994;
        auVar12._16_4_ = auVar11._16_4_ * fStack_990;
        auVar12._20_4_ = auVar11._20_4_ * fStack_98c;
        auVar12._24_4_ = auVar11._24_4_ * fStack_988;
        auVar12._28_4_ = fVar2;
        auVar22 = vfmsub231ps_fma(auVar12,auVar59,auVar67);
        auVar18 = vfmadd231ps_fma(auVar64,auVar67,ZEXT1632(auVar18));
        local_a20 = auVar15._0_4_;
        fStack_a1c = auVar15._4_4_;
        fStack_a18 = auVar15._8_4_;
        fStack_a14 = auVar15._12_4_;
        fStack_a10 = auVar15._16_4_;
        fStack_a0c = auVar15._20_4_;
        fStack_a08 = auVar15._24_4_;
        auVar71._0_4_ = fVar3 * local_a20;
        auVar71._4_4_ = fVar3 * fStack_a1c;
        auVar71._8_4_ = fVar3 * fStack_a18;
        auVar71._12_4_ = fVar3 * fStack_a14;
        auVar71._16_4_ = fVar3 * fStack_a10;
        auVar71._20_4_ = fVar3 * fStack_a0c;
        auVar71._24_4_ = fVar3 * fStack_a08;
        auVar71._28_4_ = 0;
        auVar23 = vfmsub231ps_fma(auVar71,auVar31,auVar14);
        auVar67._4_4_ = auVar22._4_4_ * fVar4;
        auVar67._0_4_ = auVar22._0_4_ * fVar4;
        auVar67._8_4_ = auVar22._8_4_ * fVar4;
        auVar67._12_4_ = auVar22._12_4_ * fVar4;
        auVar67._16_4_ = fVar4 * 0.0;
        auVar67._20_4_ = fVar4 * 0.0;
        auVar67._24_4_ = fVar4 * 0.0;
        auVar67._28_4_ = fVar4;
        auVar19 = vfmadd231ps_fma(auVar67,auVar32,ZEXT1632(auVar21));
        auVar11._4_4_ = fVar2;
        auVar11._0_4_ = fVar2;
        auVar11._8_4_ = fVar2;
        auVar11._12_4_ = fVar2;
        auVar11._16_4_ = fVar2;
        auVar11._20_4_ = fVar2;
        auVar11._24_4_ = fVar2;
        auVar11._28_4_ = fVar2;
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar11,ZEXT1632(auVar20));
        auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),ZEXT1632(auVar23),auVar59);
        auVar67 = vandps_avx(ZEXT1632(auVar19),auVar58);
        uVar44 = auVar67._0_4_;
        auVar68._0_4_ = (float)(uVar44 ^ auVar57._0_4_);
        uVar61 = auVar67._4_4_;
        auVar68._4_4_ = (float)(uVar61 ^ auVar57._4_4_);
        uVar62 = auVar67._8_4_;
        auVar68._8_4_ = (float)(uVar62 ^ auVar57._8_4_);
        uVar63 = auVar67._12_4_;
        auVar68._12_4_ = (float)(uVar63 ^ auVar57._12_4_);
        auVar60._16_4_ = auVar67._16_4_;
        auVar68._16_4_ = auVar60._16_4_;
        auVar60._20_4_ = auVar67._20_4_;
        auVar68._20_4_ = auVar60._20_4_;
        auVar60._24_4_ = auVar67._24_4_;
        auVar68._24_4_ = auVar60._24_4_;
        auVar60._28_4_ = auVar67._28_4_;
        auVar68._28_4_ = auVar60._28_4_;
        auVar57 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar23),auVar9);
        auVar65._0_4_ = (float)(uVar44 ^ auVar57._0_4_);
        auVar65._4_4_ = (float)(uVar61 ^ auVar57._4_4_);
        auVar65._8_4_ = (float)(uVar62 ^ auVar57._8_4_);
        auVar65._12_4_ = (float)(uVar63 ^ auVar57._12_4_);
        auVar65._16_4_ = auVar60._16_4_;
        auVar65._20_4_ = auVar60._20_4_;
        auVar65._24_4_ = auVar60._24_4_;
        auVar65._28_4_ = auVar60._28_4_;
        auVar67 = vcmpps_avx(auVar68,ZEXT832(0) << 0x20,5);
        auVar9 = vcmpps_avx(auVar65,ZEXT832(0) << 0x20,5);
        auVar67 = vandps_avx(auVar67,auVar9);
        auVar9 = vcmpps_avx(ZEXT1632(auVar19),ZEXT832(0) << 0x20,4);
        auVar67 = vandps_avx(auVar67,auVar9);
        auVar66._0_4_ = auVar68._0_4_ + auVar65._0_4_;
        auVar66._4_4_ = auVar68._4_4_ + auVar65._4_4_;
        auVar66._8_4_ = auVar68._8_4_ + auVar65._8_4_;
        auVar66._12_4_ = auVar68._12_4_ + auVar65._12_4_;
        auVar66._16_4_ = auVar60._16_4_ + auVar60._16_4_;
        auVar66._20_4_ = auVar60._20_4_ + auVar60._20_4_;
        auVar66._24_4_ = auVar60._24_4_ + auVar60._24_4_;
        auVar66._28_4_ = auVar60._28_4_ + auVar60._28_4_;
        auVar9._8_4_ = 0x7fffffff;
        auVar9._0_8_ = 0x7fffffff7fffffff;
        auVar9._12_4_ = 0x7fffffff;
        auVar9._16_4_ = 0x7fffffff;
        auVar9._20_4_ = 0x7fffffff;
        auVar9._24_4_ = 0x7fffffff;
        auVar9._28_4_ = 0x7fffffff;
        auVar9 = vandps_avx(ZEXT1632(auVar19),auVar9);
        auVar10 = vcmpps_avx(auVar66,auVar9,2);
        auVar59 = auVar10 & auVar67;
        if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar59 >> 0x7f,0) != '\0') ||
              (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar59 >> 0xbf,0) != '\0') ||
            (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar59[0x1f] < '\0') {
          auVar67 = vandps_avx(auVar67,auVar10);
          auVar57 = vpackssdw_avx(auVar67._0_16_,auVar67._16_16_);
          auVar26._4_4_ = auVar22._4_4_ * fStack_a1c;
          auVar26._0_4_ = auVar22._0_4_ * local_a20;
          auVar26._8_4_ = auVar22._8_4_ * fStack_a18;
          auVar26._12_4_ = auVar22._12_4_ * fStack_a14;
          auVar26._16_4_ = fStack_a10 * 0.0;
          auVar26._20_4_ = fStack_a0c * 0.0;
          auVar26._24_4_ = fStack_a08 * 0.0;
          auVar26._28_4_ = 0;
          auVar18 = vfmadd132ps_fma(auVar14,auVar26,ZEXT1632(auVar21));
          auVar18 = vfmadd132ps_fma(auVar13,ZEXT1632(auVar18),ZEXT1632(auVar20));
          auVar60._0_4_ = uVar44 ^ auVar18._0_4_;
          auVar60._4_4_ = uVar61 ^ auVar18._4_4_;
          auVar60._8_4_ = uVar62 ^ auVar18._8_4_;
          auVar60._12_4_ = uVar63 ^ auVar18._12_4_;
          fVar8 = *(float *)(ray + k * 4 + 0x60);
          auVar27._4_4_ = auVar9._4_4_ * fVar8;
          auVar27._0_4_ = auVar9._0_4_ * fVar8;
          auVar27._8_4_ = auVar9._8_4_ * fVar8;
          auVar27._12_4_ = auVar9._12_4_ * fVar8;
          auVar27._16_4_ = auVar9._16_4_ * fVar8;
          auVar27._20_4_ = auVar9._20_4_ * fVar8;
          auVar27._24_4_ = auVar9._24_4_ * fVar8;
          auVar27._28_4_ = fVar8;
          auVar67 = vcmpps_avx(auVar27,auVar60,1);
          fVar8 = *(float *)(ray + k * 4 + 0x100);
          auVar28._4_4_ = auVar9._4_4_ * fVar8;
          auVar28._0_4_ = auVar9._0_4_ * fVar8;
          auVar28._8_4_ = auVar9._8_4_ * fVar8;
          auVar28._12_4_ = auVar9._12_4_ * fVar8;
          auVar28._16_4_ = auVar9._16_4_ * fVar8;
          auVar28._20_4_ = auVar9._20_4_ * fVar8;
          auVar28._24_4_ = auVar9._24_4_ * fVar8;
          auVar28._28_4_ = fVar8;
          auVar9 = vcmpps_avx(auVar60,auVar28,2);
          auVar67 = vandps_avx(auVar67,auVar9);
          auVar18 = vpackssdw_avx(auVar67._0_16_,auVar67._16_16_);
          auVar57 = vpand_avx(auVar18,auVar57);
          auVar67 = vpmovzxwd_avx2(auVar57);
          auVar67 = vpslld_avx2(auVar67,0x1f);
          if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar67 >> 0x7f,0) != '\0') ||
                (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar67 >> 0xbf,0) != '\0') ||
              (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar67[0x1f] < '\0') {
            auVar57 = vpsllw_avx(auVar57,0xf);
            auVar57 = vpacksswb_avx(auVar57,auVar57);
            uVar46 = (ulong)(byte)(SUB161(auVar57 >> 7,0) & 1 | (SUB161(auVar57 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar57 >> 0x3f,0) << 7);
            do {
              uVar16 = 0;
              for (uVar17 = uVar46; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                uVar16 = uVar16 + 1;
              }
              if ((((context->scene->geometries).items[*(uint *)((long)&local_820 + uVar16 * 4)].ptr
                   )->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                return bVar48;
              }
              uVar46 = uVar46 ^ 1L << (uVar16 & 0x3f);
            } while (uVar46 != 0);
          }
        }
        lVar37 = lVar37 + 1;
      } while (lVar37 != uVar36 - 8);
    }
LAB_00574bdb:
    bVar48 = puVar39 != &local_800;
    if (!bVar48) {
      return bVar48;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }